

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool duckdb::Glob(char *string,idx_t slen,char *pattern,idx_t plen,bool allow_question_mark)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  bool bVar11;
  bool bVar12;
  
  uVar7 = 0;
  uVar9 = 0;
  iVar10 = slen;
  do {
    if ((slen <= uVar9) || (plen <= uVar7)) {
      iVar10 = plen;
      if (plen < uVar7) {
        iVar10 = uVar7;
      }
      for (; (uVar8 = iVar10, uVar7 < plen && (uVar8 = uVar7, pattern[uVar7] == '*'));
          uVar7 = uVar7 + 1) {
      }
      return uVar9 == slen && uVar8 == plen;
    }
    cVar1 = string[uVar9];
    cVar2 = pattern[uVar7];
    if (cVar2 == '?') {
      if (!allow_question_mark) goto LAB_01844e4d;
    }
    else if (cVar2 == '[') {
LAB_01844e4d:
      uVar8 = uVar7 + 1;
      if (uVar8 == plen) {
        return false;
      }
      lVar4 = uVar7 + 1;
      uVar6 = uVar7 + 2;
      bVar5 = pattern[lVar4] == '!';
      uVar7 = uVar8;
      bVar11 = bVar5;
      if (bVar5) {
        uVar7 = uVar6;
        uVar8 = uVar6;
      }
      while( true ) {
        bVar3 = bVar11;
        if (plen <= uVar7) {
          return false;
        }
        cVar2 = pattern[uVar7];
        if (cVar2 == ']' && uVar8 < uVar7) break;
        uVar6 = uVar7 + 1;
        if (uVar6 == plen) {
          return false;
        }
        if (pattern[uVar6] == '-') {
          if (uVar7 + 2 == plen) {
            return false;
          }
          bVar12 = cVar1 <= pattern[uVar7 + 2] && cVar2 <= cVar1;
          uVar6 = uVar7 + 3;
        }
        else {
          bVar12 = cVar2 == cVar1;
        }
        bVar11 = !bVar5;
        if (!bVar12) {
          bVar11 = bVar3;
        }
        uVar7 = uVar6;
        if ((bool)(pattern[lVar4] == '!' ^ bVar3)) {
          bVar11 = bVar3;
        }
      }
      if (!bVar3) {
        return false;
      }
    }
    else {
      if (cVar2 == '\\') {
        uVar7 = uVar7 + 1;
        if (uVar7 == plen) {
          return false;
        }
        cVar2 = pattern[uVar7];
      }
      else if (cVar2 == '*') {
        do {
          uVar8 = uVar7 + 1;
          bVar11 = true;
          if (plen <= uVar8) {
            return true;
          }
          lVar4 = uVar7 + 1;
          uVar7 = uVar8;
        } while (pattern[lVar4] == '*');
        if (plen - uVar8 != 0) {
          do {
            bVar11 = uVar9 < slen;
            if (!bVar11) {
              return bVar11;
            }
            bVar5 = Glob(string + uVar9,iVar10,pattern + uVar8,plen - uVar8,true);
            uVar9 = uVar9 + 1;
            iVar10 = iVar10 - 1;
          } while (!bVar5);
        }
        return bVar11;
      }
      if (cVar1 != cVar2) {
        return false;
      }
    }
    uVar9 = uVar9 + 1;
    uVar7 = uVar7 + 1;
    iVar10 = iVar10 - 1;
  } while( true );
}

Assistant:

bool Glob(const char *string, idx_t slen, const char *pattern, idx_t plen, bool allow_question_mark) {
	idx_t sidx = 0;
	idx_t pidx = 0;
main_loop : {
	// main matching loop
	while (sidx < slen && pidx < plen) {
		char s = string[sidx];
		char p = pattern[pidx];
		switch (p) {
		case '*': {
			// asterisk: match any set of characters
			// skip any subsequent asterisks
			pidx++;
			while (pidx < plen && pattern[pidx] == '*') {
				pidx++;
			}
			// if the asterisk is the last character, the pattern always matches
			if (pidx == plen) {
				return true;
			}
			// recursively match the remainder of the pattern
			for (; sidx < slen; sidx++) {
				if (Glob(string + sidx, slen - sidx, pattern + pidx, plen - pidx)) {
					return true;
				}
			}
			return false;
		}
		case '?':
			// when enabled: matches anything but null
			if (allow_question_mark) {
				break;
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		case '[':
			pidx++;
			goto parse_bracket;
		case '\\':
			// escape character, next character needs to match literally
			pidx++;
			// check that we still have a character remaining
			if (pidx == plen) {
				return false;
			}
			p = pattern[pidx];
			if (s != p) {
				return false;
			}
			break;
		default:
			// not a control character: characters need to match literally
			if (s != p) {
				return false;
			}
			break;
		}
		sidx++;
		pidx++;
	}
	while (pidx < plen && pattern[pidx] == '*') {
		pidx++;
	}
	// we are finished only if we have consumed the full pattern
	return pidx == plen && sidx == slen;
}
parse_bracket : {
	// inside a bracket
	if (pidx == plen) {
		return false;
	}
	// check the first character
	// if it is an exclamation mark we need to invert our logic
	char p = pattern[pidx];
	char s = string[sidx];
	bool invert = false;
	if (p == '!') {
		invert = true;
		pidx++;
	}
	bool found_match = invert;
	idx_t start_pos = pidx;
	bool found_closing_bracket = false;
	// now check the remainder of the pattern
	while (pidx < plen) {
		p = pattern[pidx];
		// if the first character is a closing bracket, we match it literally
		// otherwise it indicates an end of bracket
		if (p == ']' && pidx > start_pos) {
			// end of bracket found: we are done
			found_closing_bracket = true;
			pidx++;
			break;
		}
		// we either match a range (a-b) or a single character (a)
		// check if the next character is a dash
		if (pidx + 1 == plen) {
			// no next character!
			break;
		}
		bool matches;
		if (pattern[pidx + 1] == '-') {
			// range! find the next character in the range
			if (pidx + 2 == plen) {
				break;
			}
			char next_char = pattern[pidx + 2];
			// check if the current character is within the range
			matches = s >= p && s <= next_char;
			// shift the pattern forward past the range
			pidx += 3;
		} else {
			// no range! perform a direct match
			matches = p == s;
			// shift the pattern forward past the character
			pidx++;
		}
		if (found_match == invert && matches) {
			// found a match! set the found_matches flag
			// we keep on pattern matching after this until we reach the end bracket
			// however, we don't need to update the found_match flag anymore
			found_match = !invert;
		}
	}
	if (!found_closing_bracket) {
		// no end of bracket: invalid pattern
		return false;
	}
	if (!found_match) {
		// did not match the bracket: return false;
		return false;
	}
	// finished the bracket matching: move forward
	sidx++;
	goto main_loop;
}
}